

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O1

longdouble * __thiscall
TPZMatRed<long_double,_TPZFMatrix<long_double>_>::s
          (TPZMatRed<long_double,_TPZFMatrix<long_double>_> *this,int64_t r,int64_t c)

{
  long lVar1;
  TPZMatrix<long_double> *pTVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  long lVar6;
  longdouble *plVar7;
  
  lVar4 = r;
  if ((r < this->fDim0) &&
     (iVar3 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x10])(this), c < r && iVar3 != 0)) {
    lVar4 = c;
    c = r;
  }
  lVar1 = this->fDim0;
  if (c < lVar1 && lVar4 < lVar1) {
    pTVar2 = ((this->fK00).fRef)->fPointer;
    iVar3 = (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])(pTVar2,lVar4,c)
    ;
    return (longdouble *)CONCAT44(extraout_var,iVar3);
  }
  lVar5 = c - lVar1;
  if (lVar4 < lVar1 && lVar1 <= c) {
    if ((((lVar4 < 0) ||
         ((this->fK01).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow <= lVar4)) ||
        (lVar5 < 0)) ||
       ((this->fK01).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol <= lVar5)) {
      TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    plVar7 = (this->fK01).fElem +
             lVar5 * (this->fK01).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow;
  }
  else {
    lVar6 = c - lVar1;
    lVar5 = lVar4 - lVar1;
    if (lVar1 <= lVar4 && c < lVar1) {
      if (((-1 < lVar5) &&
          (lVar5 < (this->fK10).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow)) &&
         ((-1 < c && (c < (this->fK10).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol)))) {
        return (this->fK10).fElem +
               c * (this->fK10).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow + lVar5;
      }
      TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((lVar5 < 0) ||
        ((this->fK11).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow <= lVar5)) ||
       ((lVar6 < 0 || ((this->fK11).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol <= lVar6))
       )) {
      TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    plVar7 = (this->fK11).fElem +
             lVar6 * (this->fK11).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow;
    lVar4 = lVar5;
  }
  return plVar7 + lVar4;
}

Assistant:

TVar& TPZMatRed<TVar,TSideMatrix>::s(const int64_t r,const int64_t c ) {
	int64_t row(r),col(c);
	
	if (r < fDim0 && IsSymmetric() && row > col ) Swap( &row, &col );
	if (row<fDim0 &&  col<fDim0)  return ( fK00->s(row,col) );
	if (row<fDim0 &&  col>=fDim0)  return ( (TVar &)fK01.s(row,col-fDim0) );
	if (row>=fDim0 &&  col<fDim0)  return ( (TVar &)(fK10.s(row-fDim0,col)) );
	return ((TVar &)(fK11.s(row-fDim0,col-fDim0)) );
	
}